

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_visible_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  ImGuiWindow *pIVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  ImGuiContext *pIVar4;
  long *plVar5;
  bool bVar6;
  ImU32 col;
  ImU32 col_00;
  long lVar7;
  long lVar8;
  ushort uVar9;
  ImGuiCol idx;
  long lVar10;
  uint uVar11;
  float fVar12;
  int iVar13;
  float fVar16;
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 in_XMM6_Db;
  float fVar28;
  bool held;
  bool hovered;
  bool local_ca;
  bool local_c9;
  ImRect local_c8;
  ImGuiAxis local_b0;
  float local_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  long local_88;
  long *local_80;
  undefined1 local_78 [16];
  ImVec2 local_68;
  ImVec2 IStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  undefined1 auVar22 [16];
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems != false) {
    return false;
  }
  fVar12 = (bb_frame->Max).x - (bb_frame->Min).x;
  fVar16 = (bb_frame->Max).y - (bb_frame->Min).y;
  if (fVar12 <= 0.0) {
    return false;
  }
  if (fVar16 <= 0.0) {
    return false;
  }
  local_ac = 1.0;
  if (axis == ImGuiAxis_Y) {
    fVar24 = (GImGui->Style).FramePadding.y;
    fVar24 = fVar24 + fVar24;
    if (fVar16 < fVar24 + GImGui->FontSize) {
      fVar24 = (fVar16 - GImGui->FontSize) / fVar24;
      local_ac = 1.0;
      if (fVar24 <= 1.0) {
        local_ac = fVar24;
      }
      local_ac = (float)(~-(uint)(fVar24 < 0.0) & (uint)local_ac);
    }
  }
  if (local_ac <= 0.0) {
    return false;
  }
  iVar13 = (int)((fVar12 + -2.0) * 0.5);
  iVar17 = (int)((fVar16 + -2.0) * 0.5);
  auVar26._0_4_ = -(uint)(iVar13 < 0);
  auVar26._4_4_ = -(uint)(iVar17 < 0);
  auVar26._8_8_ = 0;
  auVar14._0_4_ = -(uint)(3 < iVar13);
  auVar14._4_4_ = -(uint)(3 < iVar17);
  auVar14._8_8_ = 0;
  auVar27._8_4_ = 0x80000000;
  auVar27._0_8_ = CONCAT44((float)iVar17,(float)iVar13) ^ 0x8000000080000000;
  auVar27._12_4_ = 0x80000000;
  auVar27 = auVar26 & _DAT_001ec590 | ~auVar26 & (auVar14 & _DAT_001f5760 | ~auVar14 & auVar27);
  fStack_a0 = auVar27._0_4_;
  fVar16 = auVar27._4_4_;
  auVar20._0_8_ = auVar27._0_8_;
  auVar20._8_4_ = fStack_a0;
  auVar20._12_4_ = fVar16;
  local_c8.Min.x = (bb_frame->Min).x;
  local_c8.Min.y = (bb_frame->Min).y;
  local_c8.Max.x = (bb_frame->Max).x;
  local_c8.Max.y = (bb_frame->Max).y;
  local_a8 = local_c8.Min.x - fStack_a0;
  fVar12 = local_c8.Min.y - fVar16;
  fStack_a0 = local_c8.Max.x + fStack_a0;
  fStack_a4 = local_c8.Max.y + fVar16;
  auVar3._4_8_ = auVar20._8_8_;
  auVar3._0_4_ = local_c8.Min.y + fVar16;
  auVar21._0_8_ = auVar3._0_8_ << 0x20;
  auVar21._8_4_ = fStack_a0;
  auVar21._12_4_ = fStack_a4;
  local_c8.Max = auVar21._8_8_;
  local_c8.Min.y = fVar12;
  local_c8.Min.x = local_a8;
  if (axis != ImGuiAxis_X) {
    fStack_a0 = fStack_a4;
    local_a8 = fVar12;
  }
  local_a8 = fStack_a0 - local_a8;
  lVar10 = size_contents_v - size_visible_v;
  if (lVar10 == 0 || size_contents_v < size_visible_v) {
    size_contents_v = size_visible_v;
  }
  if (size_contents_v < 2) {
    size_contents_v = 1;
  }
  local_78 = ZEXT416((uint)(float)size_visible_v);
  fVar24 = ((float)size_visible_v / (float)size_contents_v) * local_a8;
  fVar12 = (GImGui->Style).GrabMinSize;
  fVar16 = local_a8;
  if (fVar24 <= local_a8) {
    fVar16 = fVar24;
  }
  uVar11 = -(uint)(fVar24 < fVar12);
  local_98 = (float)(uVar11 & (uint)fVar12 | ~uVar11 & (uint)fVar16);
  local_ca = false;
  local_c9 = false;
  local_b0 = axis;
  fStack_9c = fStack_a4;
  fStack_94 = fStack_a4;
  fStack_90 = fStack_a0;
  fStack_8c = fStack_a4;
  local_80 = p_scroll_v;
  ItemAdd(bb_frame,id,(ImRect *)0x0,2);
  ButtonBehavior(&local_c8,id,&local_c9,&local_ca,0x40000);
  plVar5 = local_80;
  auVar23._4_4_ = fStack_a4;
  auVar23._0_4_ = local_a8;
  if (lVar10 < 2) {
    lVar10 = 1;
  }
  local_88 = lVar10;
  fVar12 = (float)lVar10;
  auVar15._4_4_ = (float)*local_80;
  auVar15._0_4_ = local_98;
  auVar15._8_4_ = fStack_94;
  auVar15._12_4_ = 0;
  auVar23._8_4_ = fStack_a4;
  auVar23._12_4_ = in_XMM6_Db;
  auVar22._8_8_ = auVar23._8_8_;
  auVar22._4_4_ = fVar12;
  auVar22._0_4_ = local_a8;
  auVar27 = divps(auVar15,auVar22);
  fVar24 = auVar27._0_4_;
  fVar28 = auVar27._4_4_;
  auVar2._4_4_ = -(uint)(fVar24 < 1.0);
  auVar2._0_4_ = -(uint)(fVar24 < 1.0);
  auVar2._8_4_ = -(uint)(fVar28 < 0.0);
  auVar2._12_4_ = -(uint)(fVar28 < 0.0);
  uVar11 = movmskpd(1,auVar2);
  fVar16 = 0.0;
  if (((uVar11 & 2) == 0) && (fVar16 = 1.0, fVar28 <= 1.0)) {
    fVar16 = fVar28;
  }
  fVar28 = local_a8 - local_98;
  fVar16 = (fVar16 * fVar28) / local_a8;
  if (((local_ac < 1.0) || ((uVar11 & 1) == 0)) || (local_ca == false)) goto LAB_001bbf4c;
  fVar18 = (*(float *)((pIVar4->IO).MouseDown + (long)local_b0 * 4 + -8) -
           (&local_c8.Min.x)[local_b0]) / local_a8;
  fVar19 = 1.0;
  if (fVar18 <= 1.0) {
    fVar19 = fVar18;
  }
  fVar25 = 0.0;
  fVar19 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar19);
  uVar9 = 0xffff;
  if (fVar16 <= fVar19) {
    uVar9 = (ushort)(fVar24 + fVar16 < fVar19);
  }
  if (pIVar4->ActiveIdIsJustActivated == true) {
    pIVar4->ScrollbarSeekMode = uVar9;
    if (uVar9 == 0) {
      fVar25 = fVar24 * -0.5 + (fVar19 - fVar16);
    }
    pIVar4->ScrollbarClickDeltaToGrabCenter = fVar25;
  }
  if (pIVar4->ScrollbarSeekMode == 0) {
    fVar24 = (fVar24 * -0.5 + (fVar19 - pIVar4->ScrollbarClickDeltaToGrabCenter)) / (1.0 - fVar24);
    fVar16 = 1.0;
    if (fVar24 <= 1.0) {
      fVar16 = fVar24;
    }
    lVar10 = (long)((float)(~-(uint)(fVar24 < 0.0) & (uint)fVar16) * fVar12);
LAB_001bbf1b:
    *plVar5 = lVar10;
  }
  else {
    fStack_4c = fStack_9c;
    local_58 = fVar28;
    fStack_54 = fStack_a4;
    fStack_50 = fStack_a0;
    local_48 = fVar12;
    bVar6 = IsMouseClicked(0,1,0);
    fVar12 = local_48;
    fVar28 = local_58;
    if ((bVar6) && (uVar9 == pIVar4->ScrollbarSeekMode)) {
      fVar16 = (float)local_78._0_4_;
      if (pIVar4->ScrollbarSeekMode < 1) {
        fVar16 = -(float)local_78._0_4_;
      }
      lVar7 = (long)fVar16 + *plVar5;
      lVar8 = local_88;
      if (lVar7 < local_88) {
        lVar8 = lVar7;
      }
      lVar10 = 0;
      if (-1 < lVar7) {
        lVar10 = lVar8;
      }
      goto LAB_001bbf1b;
    }
  }
  fVar12 = (float)*plVar5 / fVar12;
  fVar16 = 1.0;
  if (fVar12 <= 1.0) {
    fVar16 = fVar12;
  }
  fVar16 = (fVar28 * (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar16)) / local_a8;
LAB_001bbf4c:
  local_a8 = fVar16;
  col = GetColorU32(0xe,1.0);
  idx = 0x11;
  if (local_ca == false) {
    idx = (local_c9 & 1) + 0xf;
  }
  col_00 = GetColorU32(idx,local_ac);
  ImDrawList::AddRectFilled
            (pIVar1->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar1->WindowRounding,flags);
  if (local_b0 == ImGuiAxis_X) {
    local_68.x = local_c8.Min.x + (local_c8.Max.x - local_c8.Min.x) * local_a8;
    IStack_60.x = local_98 + local_68.x;
    IStack_60.y = local_c8.Max.y;
    local_68.y = local_c8.Min.y;
  }
  else {
    local_68.y = (local_c8.Max.y - local_c8.Min.y) * local_a8 + local_c8.Min.y;
    IStack_60.y = local_98 + local_68.y;
    IStack_60.x = local_c8.Max.x;
    local_68.x = local_c8.Min.x;
  }
  ImDrawList::AddRectFilled
            (pIVar1->DrawList,&local_68,&IStack_60,col_00,(pIVar4->Style).ScrollbarRounding,0);
  return local_ca;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_visible_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_TRUNC((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_TRUNC((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_visible_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_visible_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_visible_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ItemAdd(bb_frame, id, NULL, ImGuiItemFlags_NoNav);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_visible_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);

        const int held_dir = (clicked_v_norm < grab_v_norm) ? -1 : (clicked_v_norm > grab_v_norm + grab_h_norm) ? +1 : 0;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            g.ScrollbarSeekMode = (short)held_dir;
            g.ScrollbarClickDeltaToGrabCenter = (g.ScrollbarSeekMode == 0.0f) ? clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f : 0.0f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        if (g.ScrollbarSeekMode == 0)
        {
            // Absolute seeking
            const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
            *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);
        }
        else
        {
            // Page by page
            if (IsMouseClicked(ImGuiMouseButton_Left, ImGuiInputFlags_Repeat) && held_dir == g.ScrollbarSeekMode)
            {
                float page_dir = (g.ScrollbarSeekMode > 0.0f) ? +1.0f : -1.0f;
                *p_scroll_v = ImClamp(*p_scroll_v + (ImS64)(page_dir * size_visible_v), (ImS64)0, scroll_max);
            }
        }

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seek'ed and saturated
        //if (seek_absolute)
        //    g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}